

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_long,_long>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_long,_long> *this,unsigned_long value,bool is_valid)

{
  bool bVar1;
  ulong uVar2;
  idx_t iVar3;
  
  iVar3 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar3] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    this->compression_buffer[iVar3] = value;
    uVar2 = this->minimum;
    if (value <= this->minimum) {
      uVar2 = value;
    }
    this->minimum = uVar2;
    if (value < this->maximum) {
      value = this->maximum;
    }
    this->maximum = value;
  }
  iVar3 = this->compression_buffer_idx + 1;
  this->compression_buffer_idx = iVar3;
  if (iVar3 == 0x800) {
    bVar1 = Flush<duckdb::EmptyBitpackingWriter>(this);
    this->minimum = 0xffffffffffffffff;
    this->minimum_delta = 0x7fffffffffffffff;
    this->maximum = 0;
    this->min_max_diff = 0;
    this->maximum_delta = -0x8000000000000000;
    this->all_valid = true;
    this->all_invalid = true;
    this->can_do_delta = false;
    this->can_do_for = false;
    this->compression_buffer_idx = 0;
    this->min_max_delta_diff = 0;
    this->delta_offset = 0;
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}